

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::MethodDescriptorProto::IsInitialized(MethodDescriptorProto *this)

{
  MethodOptions *pMVar1;
  bool bVar2;
  
  if (((this->_has_bits_).has_bits_[0] & 8) == 0) {
LAB_0030041b:
    bVar2 = true;
  }
  else {
    pMVar1 = this->options_;
    bVar2 = internal::ExtensionSet::IsInitialized(&pMVar1->_extensions_);
    if (bVar2) {
      bVar2 = internal::
              AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                        (&pMVar1->uninterpreted_option_);
      if (bVar2) goto LAB_0030041b;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

void EnumDescriptorProto::set_name(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  set_has_name();
  name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:google.protobuf.EnumDescriptorProto.name)
}